

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_astore(ExecutionEngine *this)

{
  u2 uVar1;
  u4 uVar2;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar3;
  ushort uVar4;
  Value variableValue;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  variableValue = Frame::popTopOfOperandStack(this_01);
  if (variableValue.type != REFERENCE) {
    __assert_fail("value.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x4f2,"void ExecutionEngine::i_astore()");
  }
  puVar3 = Frame::getCode(this_01,this_01->pc);
  uVar4 = (ushort)puVar3[1];
  if (this->_isWide == true) {
    uVar4 = CONCAT11(puVar3[1],puVar3[2]);
    uVar2 = this_01->pc + 3;
    this->_isWide = false;
  }
  else {
    uVar2 = this_01->pc + 2;
  }
  this_01->pc = uVar2;
  uVar1 = Frame::sizeLocalVariables(this_01);
  if ((short)uVar4 < (short)uVar1) {
    Frame::changeLocalVariable(this_01,variableValue,(int)(short)uVar4);
    return;
  }
  __assert_fail("((int16_t)(topFrame->sizeLocalVariables()) > index)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x501,"void ExecutionEngine::i_astore()");
}

Assistant:

void ExecutionEngine::i_astore() {
	VMStack &stackFrame = VMStack::getInstance();
	Frame *topFrame = stackFrame.getTopFrame();

	Value value = topFrame->popTopOfOperandStack();
	assert(value.type == ValueType::REFERENCE);

	u1 *code = topFrame->getCode(topFrame->pc);
	u1 byte1 = code[1]; //índice do vetor de variáveis locais
	int16_t index = (int16_t)byte1;

	if (_isWide) {
		u1 byte2 = code[2];
		index = (byte1 << 8) | byte2;
		topFrame->pc += 3;
		_isWide = false;
	} else {
		topFrame->pc += 2;
	}

	assert(((int16_t)(topFrame->sizeLocalVariables()) > index));
	topFrame->changeLocalVariable(value, index);
}